

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TopLevelArraySizeValidator::validateSingleVariable
          (TopLevelArraySizeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  VariableDeclaration *pVVar4;
  VarType *this_00;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  allocator<char> local_389;
  string local_388;
  MessageBuilder local_368;
  MessageBuilder local_1e8;
  undefined1 local_58 [8];
  string reason;
  int expected;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  TopLevelArraySizeValidator *this_local;
  
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  std::__cxx11::string::string((string *)local_58);
  pvVar3 = std::
           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                         *)resource_local,1);
  pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar3);
  bVar1 = glu::VarType::isArrayType(&pVVar4->varType);
  if (bVar1) {
    pvVar3 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                           *)resource_local,1);
    pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar3);
    this_00 = glu::VarType::getElementType(&pVVar4->varType);
    bVar1 = glu::VarType::isBasicType(this_00);
    if (bVar1) {
      reason.field_2._12_4_ = 1;
      std::__cxx11::string::operator=
                ((string *)local_58,"Top-level block member is not an array of an aggregate type");
    }
    else {
      pvVar3 = std::
               vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
               ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                             *)resource_local,1);
      pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar3);
      iVar2 = glu::VarType::getArraySize(&pVVar4->varType);
      if (iVar2 == -1) {
        reason.field_2._12_4_ = 0;
        std::__cxx11::string::operator=
                  ((string *)local_58,"Top-level block member is an unsized top-level array");
      }
      else {
        pvVar3 = std::
                 vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 ::operator[]((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                               *)resource_local,1);
        pVVar4 = ProgramInterfaceDefinition::VariablePathComponent::getDeclaration(pvVar3);
        reason.field_2._12_4_ = glu::VarType::getArraySize(&pVVar4->varType);
        std::__cxx11::string::operator=
                  ((string *)local_58,"Top-level block member is a sized top-level array");
      }
    }
  }
  else {
    reason.field_2._12_4_ = 1;
    std::__cxx11::string::operator=((string *)local_58,"Top-level block member is not an array");
  }
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1e8,(char (*) [43])"Verifying top level array size, expecting ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(reason.field_2._M_local_buf + 0xc));
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c3c8d3);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c156ab);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  if (implementationName_local._4_4_ != reason.field_2._12_4_) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_368,(char (*) [43])"\tError, invalid top level array size, got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_368);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"top level array size invalid",&local_389);
    PropValidator::setError((PropValidator *)this,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator(&local_389);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void TopLevelArraySizeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	int			expected;
	std::string	reason;

	DE_ASSERT(path.front().isInterfaceBlock() && path.front().getInterfaceBlock()->storage == glu::STORAGE_BUFFER);
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (!path[1].getDeclaration()->varType.isArrayType())
	{
		expected = 1;
		reason = "Top-level block member is not an array";
	}
	else if (path[1].getDeclaration()->varType.getElementType().isBasicType())
	{
		expected = 1;
		reason = "Top-level block member is not an array of an aggregate type";
	}
	else if (path[1].getDeclaration()->varType.getArraySize() == glu::VarType::UNSIZED_ARRAY)
	{
		expected = 0;
		reason = "Top-level block member is an unsized top-level array";
	}
	else
	{
		expected = path[1].getDeclaration()->varType.getArraySize();
		reason = "Top-level block member is a sized top-level array";
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying top level array size, expecting " << expected << ". (" << reason << ")." << tcu::TestLog::EndMessage;

	if (propValue != expected)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid top level array size, got " << propValue << tcu::TestLog::EndMessage;
		setError("top level array size invalid");
	}
}